

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

void __thiscall spvtools::Optimizer::Impl::Impl(Impl *this,spv_target_env env)

{
  this->target_env = env;
  *(undefined8 *)&(this->pass_manager).consumer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->pass_manager).consumer_.super__Function_base._M_functor + 8) = 0;
  (this->pass_manager).consumer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->pass_manager).consumer_._M_invoker = (_Invoker_type)0x0;
  (this->pass_manager).passes_.
  super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pass_manager).passes_.
  super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pass_manager).passes_.
  super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pass_manager).print_all_stream_ = (ostream *)0x0;
  (this->pass_manager).time_report_stream_ = (ostream *)0x0;
  (this->pass_manager).target_env_ = SPV_ENV_UNIVERSAL_1_2;
  (this->pass_manager).val_options_ = (spv_validator_options)0x0;
  (this->pass_manager).validate_after_all_ = false;
  (this->live_locs)._M_h._M_buckets = &(this->live_locs)._M_h._M_single_bucket;
  (this->live_locs)._M_h._M_bucket_count = 1;
  (this->live_locs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->live_locs)._M_h._M_element_count = 0;
  (this->live_locs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->live_locs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->live_locs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit Impl(spv_target_env env) : target_env(env), pass_manager() {}